

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.cc
# Opt level: O0

void __thiscall Tiles::initoptab(Tiles *this)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    if (0xf < local_c) {
      return;
    }
    *(undefined4 *)(in_RDI + 0x4440 + (long)local_c * 0x14) = 0;
    if (3 < local_c) {
      piVar2 = (int *)(in_RDI + 0x4440 + (long)local_c * 0x14);
      iVar1 = *piVar2;
      *piVar2 = iVar1 + 1;
      *(int *)(in_RDI + (long)local_c * 0x14 + 0x4444 + (long)iVar1 * 4) = local_c + -4;
    }
    if (0 < local_c % 4) {
      piVar2 = (int *)(in_RDI + 0x4440 + (long)local_c * 0x14);
      iVar1 = *piVar2;
      *piVar2 = iVar1 + 1;
      *(int *)(in_RDI + (long)local_c * 0x14 + 0x4444 + (long)iVar1 * 4) = local_c + -1;
    }
    if (local_c % 4 < 3) {
      piVar2 = (int *)(in_RDI + 0x4440 + (long)local_c * 0x14);
      iVar1 = *piVar2;
      *piVar2 = iVar1 + 1;
      *(int *)(in_RDI + (long)local_c * 0x14 + 0x4444 + (long)iVar1 * 4) = local_c + 1;
    }
    if (local_c < 0xc) {
      piVar2 = (int *)(in_RDI + 0x4440 + (long)local_c * 0x14);
      iVar1 = *piVar2;
      *piVar2 = iVar1 + 1;
      *(int *)(in_RDI + (long)local_c * 0x14 + 0x4444 + (long)iVar1 * 4) = local_c + 4;
    }
    if (4 < *(int *)(in_RDI + 0x4440 + (long)local_c * 0x14)) break;
    local_c = local_c + 1;
  }
  __assert_fail("optab[i].n <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.cc"
                ,0x54,"void Tiles::initoptab()");
}

Assistant:

void Tiles::initoptab() {
	for (int i = 0; i < Ntiles; i++) {
		optab[i].n = 0;
		if (i >= Width)
			optab[i].ops[optab[i].n++] =  i - Width;
		if (i % Width > 0)
			optab[i].ops[optab[i].n++] =  i - 1;
		if (i % Width < Width - 1)
			optab[i].ops[optab[i].n++] =  i + 1;
		if (i < Ntiles - Width)
			optab[i].ops[optab[i].n++] =  i + Width;
		assert (optab[i].n <= 4);
	}
}